

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

void envy_bios_print_bit_P(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power *power;
  uint8_t *puVar1;
  uint uVar2;
  envy_bios_bit_entry *peVar3;
  ulong uVar4;
  ulong uVar5;
  char *name;
  envy_bios_bit_entry *local_38;
  
  local_38 = (bios->power).bit;
  if ((mask >> 10 & 1) != 0 && local_38 != (envy_bios_bit_entry *)0x0) {
    power = &bios->power;
    fprintf((FILE *)out,"BIT table \'P\' at 0x%x, version %i\n",(ulong)local_38->offset,
            (ulong)local_38->version);
    peVar3 = power->bit;
    if (peVar3->t_len != 0) {
      uVar5 = 0;
      do {
        uVar4 = (ulong)peVar3->t_offset;
        uVar2 = (uint)peVar3->t_offset + (int)uVar5 + 3;
        if (uVar2 < bios->length) {
          puVar1 = bios->data;
          uVar2 = CONCAT13(puVar1[uVar2],
                           CONCAT12(puVar1[uVar5 + 2 + uVar4],
                                    *(undefined2 *)(puVar1 + uVar5 + uVar4)));
          if (uVar2 != 0) {
            local_38 = (envy_bios_bit_entry *)0x27639e;
            parse_at(bios,power,-1,(int)uVar5,(char **)&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",uVar5 & 0xffffffff,(ulong)uVar2,
                    local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n",uVar4 + uVar5);
        }
        peVar3 = power->bit;
        uVar5 = uVar5 + 4;
      } while ((uint)uVar5 < (uint)peVar3->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void envy_bios_print_bit_P (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power *power = &bios->power;
	const char *name;
	uint32_t addr;
	int ret = 0, i = 0;
	
	if (!power->bit || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "BIT table 'P' at 0x%x, version %i\n", 
		power->bit->offset, power->bit->version);

	for (i = 0; i < power->bit->t_len; i+=4) {
		ret = bios_u32(bios, power->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, power, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}
	
	fprintf(out, "\n");
}